

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterDcStatAccess.cpp
# Opt level: O1

long __thiscall bhf::ads::MasterDcStatAccess::Print(MasterDcStatAccess *this,ostream *os)

{
  ostream *poVar1;
  AdsException *this_00;
  long lVar2;
  uint32_t bytesRead;
  array<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
  rowNames;
  anon_struct_96_6_2ef3beec stat;
  string local_248;
  uint32_t local_224;
  long local_220;
  long *local_218;
  long lStack_210;
  long local_208 [2];
  undefined1 *local_1f8;
  uint auStack_1f0 [2];
  undefined1 local_1e8 [16];
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [88];
  undefined1 local_90 [96];
  
  local_220 = AdsDevice::ReadReqEx2(&this->device,0x2f,0,0x60,local_90,&local_224);
  if (local_220 == 0) {
    if (local_224 != 0x60) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_218);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Print",5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"Corrupt ECAT_DC_TIMING_STAT length.\n",0x24);
      std::__cxx11::stringbuf::str();
      Logger::Log(3,&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_248._M_dataplus._M_p._1_7_,local_248._M_dataplus._M_p._0_1_) !=
          &local_248.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_248._M_dataplus._M_p._1_7_,local_248._M_dataplus._M_p._0_1_))
        ;
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_218);
      std::ios_base::~ios_base((ios_base *)local_198);
      this_00 = (AdsException *)__cxa_allocate_exception(0x30);
      AdsException::AdsException(this_00,0x706);
      __cxa_throw(this_00,&AdsException::typeinfo,AdsException::~AdsException);
    }
    local_218 = local_208;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"1","");
    local_1f8 = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"2","");
    local_1d8[0] = local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"5","");
    local_1b8[0] = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"10","");
    local_198[0] = local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"20","");
    local_178[0] = local_168;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"50","");
    local_158[0] = local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"100","");
    local_138[0] = local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"200","");
    local_118[0] = local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"500","");
    local_f8[0] = local_e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,anon_var_dwarf_3ecbc,anon_var_dwarf_3ecbc + 3);
    std::__ostream_insert<char,std::char_traits<char>>(os,"Deviation <",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(os," | ",3);
    std::__ostream_insert<char,std::char_traits<char>>(os,"Count (neg)",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(os," | ",3);
    std::__ostream_insert<char,std::char_traits<char>>(os,"Count (pos)",0xb);
    local_248._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_248,1);
    lVar2 = 0;
    do {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(char *)(&local_218)[lVar2],local_208[lVar2 + -1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," | ",3);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," | ",3);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      local_248._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_248,1);
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x28);
    std::__ostream_insert<char,std::char_traits<char>>(os,"Sum",3);
    std::__ostream_insert<char,std::char_traits<char>>(os," | ",3);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," | ",3);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    local_248._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_248,1);
    lVar2 = 0;
    do {
      if (local_e8 + lVar2 != *(undefined1 **)((long)local_f8 + lVar2)) {
        operator_delete(*(undefined1 **)((long)local_f8 + lVar2));
      }
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x140);
  }
  else {
    if (local_220 == 0x712) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_218);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"Reading DC diagnosis failed with 0x",0x23);
      *(uint *)((long)auStack_1f0 + *(long *)(local_208[0] + -0x18)) =
           *(uint *)((long)auStack_1f0 + *(long *)(local_208[0] + -0x18)) & 0xffffffb5 | 8;
      poVar1 = std::ostream::_M_insert<long>((long)local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,". Try activating it first (\'adstool dc-diag activate\').",0x37);
      std::__cxx11::stringbuf::str();
      Logger::Log(3,&local_248);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_218);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"Reading DC diagnosis failed with 0x",0x23);
      *(uint *)((long)auStack_1f0 + *(long *)(local_208[0] + -0x18)) =
           *(uint *)((long)auStack_1f0 + *(long *)(local_208[0] + -0x18)) & 0xffffffb5 | 8;
      std::ostream::_M_insert<long>((long)local_208);
      std::__cxx11::stringbuf::str();
      Logger::Log(3,&local_248);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_248._M_dataplus._M_p._1_7_,local_248._M_dataplus._M_p._0_1_) !=
        &local_248.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_248._M_dataplus._M_p._1_7_,local_248._M_dataplus._M_p._0_1_));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_218);
    std::ios_base::~ios_base((ios_base *)local_198);
  }
  return local_220;
}

Assistant:

long MasterDcStatAccess::Print(std::ostream& os) const
{
    uint32_t bytesRead;

    struct {
        uint32_t count;
        uint32_t pos;
        uint32_t neg;
        uint32_t maxDiff;
        uint32_t posArr[10];
        uint32_t negArr[10];
    } stat;

    const auto status = device.ReadReqEx2(
        ECADS_IGRP_MASTER_DC_STAT,
        0,
        sizeof(stat),
        &stat,
        &bytesRead
        );

    if (status == ADSERR_DEVICE_INVALIDSTATE) {
        LOG_ERROR(
            "Reading DC diagnosis failed with 0x" << std::hex << status <<
                ". Try activating it first ('adstool dc-diag activate').");
        return status;
    } else if (status != ADSERR_NOERR) {
        LOG_ERROR("Reading DC diagnosis failed with 0x" << std::hex << status);
        return status;
    } else if (bytesRead != sizeof(stat)) {
        LOG_ERROR(__FUNCTION__ << "Corrupt ECAT_DC_TIMING_STAT length.\n");
        throw AdsException(ADSERR_DEVICE_INVALIDDATA);
    }

    const std::array<const std::string, sizeof(stat.posArr) / sizeof(stat.posArr[0])> rowNames{{
        "1",
        "2",
        "5",
        "10",
        "20",
        "50",
        "100",
        "200",
        "500",
        "\u221E" // infinity symbol
    }};

    os << "Deviation <" << " | " << "Count (neg)" << " | " << "Count (pos)" << '\n';
    for (size_t i = 0; i < rowNames.size(); i++) {
        os << rowNames[i] << " | " << stat.negArr[i] << " | " << stat.posArr[i] << '\n';
    }
    os << "Sum" << " | " << stat.neg << " | " << stat.pos << '\n';

    return status;
}